

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

int uECC_valid_public_key(uint8_t *public_key,uECC_Curve curve)

{
  uECC_word_t *native;
  char cVar1;
  byte num_words;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined1 auVar8 [16];
  uECC_word_t _public [8];
  uECC_word_t tmp1 [4];
  uECC_word_t product [8];
  undefined8 local_c8;
  uint auStack_c0 [14];
  uECC_word_t local_88 [4];
  uECC_word_t local_68 [8];
  
  cVar1 = curve->num_bytes;
  uECC_vli_bytesToNative(&local_c8,public_key,(int)cVar1);
  num_words = curve->num_words;
  native = &local_c8 + (char)num_words;
  uECC_vli_bytesToNative(native,public_key + cVar1,(int)cVar1);
  if ((char)(num_words * '\x02') < '\x01') {
    return 0;
  }
  uVar5 = (uint)num_words;
  uVar7 = 0;
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  uVar3 = 0;
  do {
    uVar7 = uVar7 | *(uint *)(&local_c8 + uVar3);
    uVar9 = uVar9 | auStack_c0[uVar3 * 2 + -1];
    uVar10 = uVar10 | (uint)local_88[uVar3 - 7];
    uVar11 = uVar11 | *(uint *)((long)local_88 + uVar3 * 8 + -0x34);
    uVar3 = uVar3 + 2;
  } while ((byte)(num_words * '\x02') != uVar3);
  auVar8._0_4_ = -(uint)(uVar7 == 0);
  auVar8._4_4_ = -(uint)(uVar9 == 0);
  auVar8._8_4_ = -(uint)(uVar10 == 0);
  auVar8._12_4_ = -(uint)(uVar11 == 0);
  iVar2 = movmskps((int)uVar3,auVar8);
  uVar7 = uVar5;
  if (iVar2 == 0xf) {
    return 0;
  }
  while( true ) {
    uVar7 = uVar7 - 1;
    if ((char)uVar7 < '\0') {
      return 0;
    }
    uVar4 = (ulong)((uVar7 & 0x7f) << 3);
    uVar3 = *(ulong *)((long)curve->p + uVar4);
    uVar4 = *(ulong *)((long)&local_c8 + uVar4);
    if (uVar4 < uVar3) break;
    if (uVar3 < uVar4) {
      return 0;
    }
  }
  while( true ) {
    uVar5 = uVar5 - 1;
    if ((char)uVar5 < '\0') {
      return 0;
    }
    uVar4 = (ulong)((uVar5 & 0x7f) << 3);
    uVar3 = *(ulong *)((long)curve->p + uVar4);
    uVar4 = *(ulong *)((long)native + uVar4);
    if (uVar4 < uVar3) break;
    if (uVar3 < uVar4) {
      return 0;
    }
  }
  uECC_vli_mult(local_68,native,native,num_words);
  (*curve->mmod_fast)(local_88,local_68);
  (*curve->x_side)(local_68,&local_c8,curve);
  if (-1 < (char)(num_words - 1)) {
    uVar3 = (ulong)(byte)(num_words - 1);
    uVar4 = 0;
    do {
      uVar4 = uVar4 | local_68[uVar3] ^ local_88[uVar3];
      bVar6 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar6);
    return (uint)(uVar4 == 0);
  }
  return 1;
}

Assistant:

int uECC_valid_public_key(const uint8_t *public_key, uECC_Curve curve) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *_public = (uECC_word_t *)public_key;
#else
    uECC_word_t _public[uECC_MAX_WORDS * 2];
#endif

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_bytesToNative(_public, public_key, curve->num_bytes);
    uECC_vli_bytesToNative(
        _public + curve->num_words, public_key + curve->num_bytes, curve->num_bytes);
#endif
    return uECC_valid_point(_public, curve);
}